

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WordEmbedding.pb.h
# Opt level: O2

bool CoreML::Specification::operator==(WordEmbedding *a,WordEmbedding *b)

{
  size_t __n;
  bool bVar1;
  int iVar2;
  undefined8 *puVar3;
  undefined8 *puVar4;
  
  if (a->revision_ != b->revision_) {
    return false;
  }
  bVar1 = std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          ((ulong)(a->language_).tagged_ptr_.ptr_ & 0xfffffffffffffffe),
                          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          ((ulong)(b->language_).tagged_ptr_.ptr_ & 0xfffffffffffffffe));
  if (!bVar1) {
    puVar3 = (undefined8 *)((ulong)(a->modelparameterdata_).tagged_ptr_.ptr_ & 0xfffffffffffffffe);
    __n = puVar3[1];
    puVar4 = (undefined8 *)((ulong)(b->modelparameterdata_).tagged_ptr_.ptr_ & 0xfffffffffffffffe);
    if ((__n == puVar4[1]) &&
       ((__n == 0 || (iVar2 = bcmp((void *)*puVar3,(void *)*puVar4,__n), iVar2 == 0)))) {
      return true;
    }
  }
  return false;
}

Assistant:

inline uint32_t WordEmbedding::_internal_revision() const {
  return revision_;
}